

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DETECT_FEARFUL_MONSTERS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  _Bool monsters;
  effect_handler_context_t_conflict *context_local;
  
  _Var1 = detect_monsters(context->y,context->x,monster_is_fearful);
  if (_Var1) {
    msg("These monsters could provide good sport.");
  }
  else if ((context->aware & 1U) != 0) {
    msg("You smell no fear in the air.");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_FEARFUL_MONSTERS(effect_handler_context_t *context)
{
	bool monsters = detect_monsters(context->y, context->x, monster_is_fearful);

	if (monsters)
		msg("These monsters could provide good sport.");
	else if (context->aware)
		msg("You smell no fear in the air.");

	context->ident = true;
	return true;
}